

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *env;
  pointer pcVar2;
  bool bVar3;
  Status SVar4;
  VersionSet *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined4 extraout_var;
  Version *v;
  pointer ppVar10;
  undefined1 *in_RDX;
  uint64_t uVar11;
  VersionSet *pVVar12;
  ulong uVar13;
  bool bVar14;
  Status s;
  SequentialFile *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string scratch;
  string dscname;
  string current;
  Slice record;
  VersionEdit edit;
  LogReporter reporter;
  Reader reader;
  Builder builder;
  Status local_3d8;
  uint64_t local_3d0;
  VersionSet *local_3c8;
  uint64_t local_3c0;
  ulong local_3b8;
  SequentialFile *local_3b0;
  uint64_t local_3a8;
  Status local_3a0;
  undefined1 local_398 [56];
  SequenceNumber local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined1 local_348 [32];
  string local_328;
  Slice local_308;
  Slice local_2f8;
  VersionEdit local_2e8;
  Slice local_240;
  Reporter local_230;
  undefined1 *local_228;
  Reader local_220;
  undefined1 local_1c8 [408];
  
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  env = *(Env **)save_manifest;
  local_3c8 = (VersionSet *)save_manifest;
  local_398._40_8_ = in_RDX;
  CurrentFileName((string *)local_1c8,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&local_3d8,env,(string *)local_1c8,&local_328);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1c8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar1) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    this->env_ = (Env *)local_3d8.state_;
    local_3d8.state_ = (char *)0x0;
    goto LAB_0011b206;
  }
  if (((_Base_ptr)local_328._M_string_length == (_Base_ptr)0x0) ||
     (local_328._M_dataplus._M_p
      [(long)((long)&((_Base_ptr)(local_328._M_string_length + -0x20))->_M_right + 7)] != '\n')) {
    local_1c8._0_8_ = "CURRENT file does not end with newline";
    local_1c8._8_8_ = (Version *)0x26;
    local_2e8.comparator_._M_dataplus._M_p = "";
    local_2e8.comparator_._M_string_length = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)local_1c8,(Slice *)&local_2e8);
    goto LAB_0011b206;
  }
  std::__cxx11::string::resize((ulong)&local_328,(char)local_328._M_string_length + -1);
  pcVar2 = (local_3c8->dbname_)._M_dataplus._M_p;
  local_1c8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + (local_3c8->dbname_)._M_string_length);
  std::__cxx11::string::append((char *)local_1c8);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_1c8,(ulong)local_328._M_dataplus._M_p);
  pVVar12 = local_3c8;
  local_348._0_8_ = local_348 + 0x10;
  ppVar10 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == ppVar10) {
    local_348._16_8_ = *(undefined8 *)ppVar10;
    local_348._24_8_ = plVar9[3];
  }
  else {
    local_348._16_8_ = *(undefined8 *)ppVar10;
    local_348._0_8_ = (pointer)*plVar9;
  }
  local_348._8_8_ = plVar9[1];
  *plVar9 = (long)ppVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar1) {
    operator_delete((void *)local_1c8._0_8_);
  }
  (*pVVar12->env_->_vptr_Env[2])(local_1c8,pVVar12->env_,local_348,&local_3b0);
  SVar4.state_ = local_3d8.state_;
  local_3d8.state_ = (char *)local_1c8._0_8_;
  local_1c8._0_8_ = SVar4.state_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SVar4.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(SVar4.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.state_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_398._32_8_ = this;
    Builder::Builder((Builder *)local_1c8,pVVar12,pVVar12->current_);
    local_230._vptr_Reporter = (_func_int **)&PTR__Reporter_001778d0;
    local_228 = (undefined1 *)&local_3d8;
    log::Reader::Reader(&local_220,local_3b0,&local_230,true,0);
    local_2f8.data_ = "";
    local_2f8.size_ = 0;
    local_398._48_8_ = &local_358;
    local_3a8 = 0;
    local_360 = 0;
    local_358._M_local_buf[0] = '\0';
    bVar5 = log::Reader::ReadRecord(&local_220,&local_2f8,(string *)(local_398 + 0x30));
    bVar7 = false;
    if (bVar5) {
      bVar5 = false;
      bVar14 = false;
      uVar11 = 0;
      local_3c0 = 0;
      local_3d0 = 0;
      uVar13 = 0;
      bVar7 = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8.state_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_3d0 = 0;
        local_3b8 = 0;
        local_3c0 = 0;
        uVar11 = 0;
        bVar14 = false;
        bVar5 = false;
        bVar3 = false;
        bVar7 = false;
        do {
          local_2e8.comparator_._M_dataplus._M_p = (pointer)&local_2e8.comparator_.field_2;
          local_2e8.comparator_._M_string_length = 0;
          local_2e8.comparator_.field_2._M_local_buf[0] = '\0';
          local_2e8.compact_pointers_.
          super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2e8.compact_pointers_.
          super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2e8.compact_pointers_.
          super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header;
          local_2e8.new_files_.
          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2e8.new_files_.
          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_2e8.new_files_.
          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2e8.deleted_files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          VersionEdit::Clear(&local_2e8);
          VersionEdit::DecodeFrom((VersionEdit *)local_398,(Slice *)&local_2e8);
          SVar4.state_ = local_3d8.state_;
          local_3d8.state_ = (char *)local_398._0_8_;
          local_398._0_8_ = SVar4.state_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)SVar4.state_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(SVar4.state_);
          }
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3d8.state_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) && (local_2e8.has_comparator_ == true)) {
            (*((local_3c8->icmp_).user_comparator_)->_vptr_Comparator[3])();
            iVar8 = std::__cxx11::string::compare((char *)&local_2e8);
            if (iVar8 != 0) {
              local_398._0_8_ = local_398 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_398,local_2e8.comparator_._M_dataplus._M_p,
                         local_2e8.comparator_._M_dataplus._M_p +
                         local_2e8.comparator_._M_string_length);
              std::__cxx11::string::append((char *)local_398);
              local_240.data_._0_4_ = local_398._0_4_;
              local_240.data_._4_4_ = local_398._4_4_;
              local_240.size_._0_4_ = local_398._8_4_;
              local_240.size_._4_4_ = local_398._12_4_;
              iVar8 = (*((local_3c8->icmp_).user_comparator_)->_vptr_Comparator[3])();
              local_308.data_ = (char *)CONCAT44(extraout_var,iVar8);
              local_308.size_ = strlen(local_308.data_);
              Status::Status(&local_3a0,kInvalidArgument,&local_240,&local_308);
              SVar4.state_ = local_3d8.state_;
              local_3d8.state_ = local_3a0.state_;
              local_3a0.state_ = SVar4.state_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)SVar4.state_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete__(SVar4.state_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_398 + 0x10)) {
                operator_delete((void *)local_398._0_8_);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8.state_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            Builder::Apply((Builder *)local_1c8,&local_2e8);
          }
          if (local_2e8.has_log_number_ != false) {
            bVar7 = true;
            local_3b8 = local_2e8.log_number_;
          }
          if (local_2e8.has_prev_log_number_ != false) {
            bVar3 = true;
            local_3d0 = local_2e8.prev_log_number_;
          }
          if (local_2e8.has_next_file_number_ != false) {
            bVar5 = true;
            uVar11 = local_2e8.next_file_number_;
          }
          if (local_2e8.has_last_sequence_ != false) {
            bVar14 = true;
            local_3c0 = local_2e8.last_sequence_;
          }
          VersionEdit::~VersionEdit(&local_2e8);
          bVar6 = log::Reader::ReadRecord(&local_220,&local_2f8,(string *)(local_398 + 0x30));
        } while ((bVar6) &&
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3d8.state_ ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0));
        local_3a8 = 0;
        uVar13 = local_3b8;
        if (bVar3) {
          local_3a8 = local_3d0;
        }
      }
    }
    else {
      bVar5 = false;
      bVar14 = false;
      uVar11 = 0;
      local_3c0 = 0;
      local_3d0 = 0;
      uVar13 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._48_8_ != &local_358) {
      operator_delete((void *)local_398._48_8_);
    }
    log::Reader::~Reader(&local_220);
    log::Reader::Reporter::~Reporter(&local_230);
    if (local_3b0 != (SequentialFile *)0x0) {
      (*local_3b0->_vptr_SequentialFile[1])();
    }
    local_3b0 = (SequentialFile *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.state_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (bVar5) {
        if (!bVar7) {
          local_2e8.comparator_._M_dataplus._M_p = "no meta-lognumber entry in descriptor";
          local_2e8.comparator_._M_string_length = 0x25;
          goto LAB_0011b080;
        }
        if (!bVar14) {
          local_2e8.comparator_._M_dataplus._M_p = "no last-sequence-number entry in descriptor";
          local_2e8.comparator_._M_string_length = 0x2b;
          goto LAB_0011b080;
        }
      }
      else {
        local_2e8.comparator_._M_dataplus._M_p = "no meta-nextfile entry in descriptor";
        local_2e8.comparator_._M_string_length = 0x24;
LAB_0011b080:
        local_220.file_ = (SequentialFile *)0x15ba87;
        local_220.reporter_ = (Reporter *)0x0;
        Status::Status((Status *)(local_398 + 0x30),kCorruption,(Slice *)&local_2e8,
                       (Slice *)&local_220);
        SVar4.state_ = local_3d8.state_;
        local_3d8.state_ = (char *)local_398._48_8_;
        local_398._48_8_ = SVar4.state_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SVar4.state_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(SVar4.state_);
        }
      }
      if (local_3c8->next_file_number_ <= local_3a8) {
        local_3c8->next_file_number_ = local_3a8 + 1;
      }
      if (local_3c8->next_file_number_ <= uVar13) {
        local_3c8->next_file_number_ = uVar13 + 1;
      }
      local_3d0 = local_3a8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.state_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      v = (Version *)operator_new(0xe8);
      this_00 = local_3c8;
      v->vset_ = local_3c8;
      v->next_ = v;
      v->prev_ = v;
      v->refs_ = 0;
      memset(v->files_,0,0xb0);
      v->file_to_compact_level_ = -1;
      v->compaction_score_ = -1.0;
      v->compaction_level_ = -1;
      pVVar12 = (VersionSet *)local_1c8;
      Builder::SaveTo((Builder *)pVVar12,v);
      Finalize(pVVar12,v);
      AppendVersion(this_00,v);
      this_00->manifest_file_number_ = uVar11;
      this_00->next_file_number_ = uVar11 + 1;
      this_00->last_sequence_ = local_3c0;
      this_00->log_number_ = uVar13;
      this_00->prev_log_number_ = local_3d0;
      bVar7 = ReuseManifest(this_00,(string *)local_348,&local_328);
      if (!bVar7) {
        *(undefined1 *)local_398._40_8_ = 1;
      }
    }
    this = (VersionSet *)local_398._32_8_;
    *(Env **)local_398._32_8_ = (Env *)local_3d8.state_;
    local_3d8.state_ = (char *)0x0;
    Builder::~Builder((Builder *)local_1c8);
  }
  else if (local_3d8.state_[4] == '\x01') {
    local_2e8.comparator_._M_dataplus._M_p = "CURRENT points to a non-existent file";
    local_2e8.comparator_._M_string_length = 0x25;
    Status::ToString_abi_cxx11_((string *)local_1c8,&local_3d8);
    local_220.file_ = (SequentialFile *)local_1c8._0_8_;
    local_220.reporter_ = (Reporter *)local_1c8._8_8_;
    Status::Status((Status *)this,kCorruption,(Slice *)&local_2e8,(Slice *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != paVar1) {
      operator_delete((void *)local_1c8._0_8_);
    }
  }
  else {
    this->env_ = (Env *)local_3d8.state_;
    local_3d8.state_ = (char *)0x0;
  }
  if ((pointer)local_348._0_8_ != (pointer)(local_348 + 0x10)) {
    operator_delete((void *)local_348._0_8_);
  }
LAB_0011b206:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_3d8.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}